

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O3

QList<QNetworkCookie> * __thiscall
QNetworkCookieJar::cookiesForUrl
          (QList<QNetworkCookie> *__return_storage_ptr__,QNetworkCookieJar *this,QUrl *url)

{
  long lVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  CutResult CVar8;
  iterator iVar9;
  iterator iVar10;
  ulong uVar11;
  char16_t *pcVar12;
  QArrayData *pQVar13;
  storage_type_conflict *psVar14;
  long lVar15;
  QArrayData *pQVar16;
  QNetworkCookie *cookie;
  QNetworkCookie *pQVar17;
  long in_FS_OFFSET;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView domain;
  QLatin1String QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QDateTime now;
  char local_c4;
  QString local_a8;
  QArrayData *local_90;
  storage_type_conflict *local_88;
  long local_80;
  QString local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  QArrayData *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QNetworkCookie *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QUrl::scheme();
  if (local_48 == (QArrayData *)0x5) {
    QVar18.m_data._4_4_ = uStack_4c;
    QVar18.m_data._0_4_ = uStack_50;
    QVar18.m_size = 5;
    QVar24.m_data = "https";
    QVar24.m_size = 5;
    local_c4 = QtPrivate::equalStrings(QVar18,QVar24);
  }
  else {
    local_c4 = '\0';
  }
  piVar3 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
    }
  }
  lVar15 = *(long *)(lVar1 + 0x88);
  if (lVar15 != 0) {
    pQVar17 = *(QNetworkCookie **)(lVar1 + 0x80);
    lVar15 = lVar15 << 3;
    do {
      if ((local_c4 != '\0') || (bVar6 = QNetworkCookie::isSecure(pQVar17), !bVar6)) {
        bVar6 = QNetworkCookie::isSessionCookie(pQVar17);
        if (!bVar6) {
          QNetworkCookie::expirationDate((QNetworkCookie *)&local_58);
          cVar7 = compareThreeWay((QDateTime *)&local_58,(QDateTime *)&local_40);
          QDateTime::~QDateTime((QDateTime *)&local_58);
          if (cVar7 < '\0') goto LAB_0018ad53;
        }
        local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = 0xaaaaaaaa;
        uStack_54 = 0xaaaaaaaa;
        uStack_50 = 0xaaaaaaaa;
        uStack_4c = 0xaaaaaaaa;
        QUrl::host(&local_58,url,0x7f00000);
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QNetworkCookie::domain(&local_78,pQVar17);
        pQVar16 = local_48;
        qVar5 = local_78.d.size;
        pcVar4 = local_78.d.ptr;
        psVar14 = (storage_type_conflict *)CONCAT44(uStack_4c,uStack_50);
        if (((QArrayData *)local_78.d.size == (QArrayData *)0x0) || (*local_78.d.ptr != L'.')) {
          pcVar12 = local_78.d.ptr;
          if (local_48 == (QArrayData *)local_78.d.size) {
LAB_0018ab52:
            QVar20.m_data = psVar14;
            QVar20.m_size = (qsizetype)pQVar16;
            QVar26.m_data = pcVar12;
            QVar26.m_size = (qsizetype)pQVar16;
            cVar7 = QtPrivate::equalStrings(QVar20,QVar26);
            if (cVar7 != '\0') goto LAB_0018ab5f;
          }
        }
        else {
          QVar19.m_data = psVar14;
          QVar19.m_size = (qsizetype)local_48;
          QVar25.m_data = local_78.d.ptr;
          QVar25.m_size = local_78.d.size;
          cVar7 = QtPrivate::endsWith(QVar19,QVar25,CaseSensitive);
          if (cVar7 == '\0') {
            local_90 = (QArrayData *)0x1;
            local_a8.d.d = (Data *)0xffffffffffffffff;
            CVar8 = QtPrivate::QContainerImplHelper::mid
                              (qVar5,(qsizetype *)&local_90,(qsizetype *)&local_a8);
            pQVar13 = &(local_a8.d.d)->super_QArrayData;
            if (CVar8 == Null) {
              pQVar13 = (QArrayData *)0x0;
            }
            if (pQVar13 == pQVar16) {
              pcVar12 = (storage_type_conflict *)0x0;
              if (CVar8 != Null) {
                pcVar12 = pcVar4 + (long)local_90;
              }
              goto LAB_0018ab52;
            }
          }
          else {
LAB_0018ab5f:
            QUrl::path(&local_90,url,0x7f00000);
            lVar1 = local_80;
            psVar14 = local_88;
            QNetworkCookie::path(&local_a8,pQVar17);
            qVar5 = local_a8.d.size;
            pcVar4 = local_a8.d.ptr;
            if (local_a8.d.size == 1 && lVar1 == 0) {
              QVar21.m_data = "/";
              QVar21.m_size = 1;
              QVar27.m_data = local_a8.d.ptr;
              QVar27.m_size = 1;
              cVar7 = QtPrivate::equalStrings(QVar21,QVar27);
              if ((cVar7 == '\0') &&
                 (auVar2._8_8_ = 0, auVar2._0_8_ = psVar14, QVar28.m_data = pcVar4,
                 QVar28.m_size = 1,
                 cVar7 = QtPrivate::startsWith((QStringView)(auVar2 << 0x40),QVar28,CaseSensitive),
                 cVar7 == '\0')) goto LAB_0018ac25;
LAB_0018ac0a:
              bVar6 = true;
              if (pcVar4[qVar5 + -1] != L'/') {
LAB_0018ac16:
                bVar6 = true;
                if (psVar14[qVar5] != L'/') goto LAB_0018ac25;
              }
            }
            else {
              QVar22.m_data = psVar14;
              QVar22.m_size = lVar1;
              QVar29.m_data = local_a8.d.ptr;
              QVar29.m_size = local_a8.d.size;
              cVar7 = QtPrivate::startsWith(QVar22,QVar29,CaseSensitive);
              if (cVar7 != '\0') {
                bVar6 = true;
                if (lVar1 != qVar5) {
                  if (qVar5 != 0) goto LAB_0018ac0a;
                  goto LAB_0018ac16;
                }
                goto LAB_0018ac28;
              }
LAB_0018ac25:
              bVar6 = false;
            }
LAB_0018ac28:
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_90 != (QArrayData *)0x0) {
              LOCK();
              (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_90,2,0x10);
              }
            }
            if (bVar6) {
              psVar14 = local_78.d.ptr;
              if ((QArrayData *)local_78.d.size == (QArrayData *)0x0) {
                pQVar16 = (QArrayData *)0x0;
              }
              else {
                pQVar16 = (QArrayData *)local_78.d.size;
                if (*local_78.d.ptr == L'.') {
                  pQVar16 = (QArrayData *)
                            ((long)&((QArrayData *)(local_78.d.size + -0x10))->alloc + 7);
                  psVar14 = local_78.d.ptr + 1;
                }
              }
              if (((local_48 == pQVar16) &&
                  (QVar23.m_data._4_4_ = uStack_4c, QVar23.m_data._0_4_ = uStack_50,
                  QVar23.m_size = (qsizetype)pQVar16, QVar30.m_data = psVar14,
                  QVar30.m_size = (qsizetype)pQVar16, cVar7 = QtPrivate::equalStrings(QVar23,QVar30)
                  , cVar7 != '\0')) ||
                 (domain.m_data = psVar14, domain.m_size = (qsizetype)pQVar16,
                 bVar6 = qIsEffectiveTLD(domain), !bVar6)) {
                QtPrivate::QMovableArrayOps<QNetworkCookie>::emplace<QNetworkCookie_const&>
                          ((QMovableArrayOps<QNetworkCookie> *)__return_storage_ptr__,
                           (__return_storage_ptr__->d).size,pQVar17);
                QList<QNetworkCookie>::end(__return_storage_ptr__);
              }
            }
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar3 = (int *)CONCAT44(uStack_54,local_58);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
          }
        }
      }
LAB_0018ad53:
      pQVar17 = pQVar17 + 1;
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
  }
  iVar9 = QList<QNetworkCookie>::begin(__return_storage_ptr__);
  iVar10 = QList<QNetworkCookie>::end(__return_storage_ptr__);
  if (iVar9.i != iVar10.i) {
    uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
    lVar1 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QNetworkCookie>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
              (iVar9.i,iVar10.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)iVar10.i - (long)iVar9.i < 0x81) {
      std::
      __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                (iVar9.i,iVar10.i);
    }
    else {
      pQVar17 = iVar9.i + 0x10;
      std::
      __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                (iVar9.i,pQVar17);
      for (; pQVar17 != iVar10.i; pQVar17 = pQVar17 + 1) {
        std::
        __unguarded_linear_insert<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                  (pQVar17);
      }
    }
  }
  QDateTime::~QDateTime((QDateTime *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QNetworkCookie> QNetworkCookieJar::cookiesForUrl(const QUrl &url) const
{
//     \b Warning! This is only a dumb implementation!
//     It does NOT follow all of the recommendations from
//     http://wp.netscape.com/newsref/std/cookie_spec.html
//     It does not implement a very good cross-domain verification yet.

    Q_D(const QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    QList<QNetworkCookie> result;
    const bool isEncrypted = url.scheme() == "https"_L1;

    // scan our cookies for something that matches
    for (const auto &cookie : std::as_const(d->allCookies)) {
        if (!isEncrypted && cookie.isSecure())
            continue;
        if (!cookie.isSessionCookie() && cookie.expirationDate() < now)
            continue;
        const QString urlHost = url.host();
        const QString cookieDomain = cookie.domain();
        if (!isParentDomain(urlHost, cookieDomain))
            continue;
        if (!isParentPath(url.path(), cookie.path()))
            continue;

        QStringView domain = cookieDomain;
        if (domain.startsWith(u'.')) /// Qt6?: remove when compliant with RFC6265
            domain = domain.sliced(1);
#if QT_CONFIG(topleveldomain)
        if (urlHost != domain && qIsEffectiveTLD(domain))
            continue;
#else
        if (!domain.contains(u'.') && urlHost != domain)
            continue;
#endif // topleveldomain

        result += cookie;
    }

    auto longerPath = [](const auto &c1, const auto &c2)
                      { return c1.path().size() > c2.path().size(); };
    std::sort(result.begin(), result.end(), longerPath);
    return result;
}